

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateUtilities.cpp
# Opt level: O0

double Js::DateUtilities::DblModPos(double dbl,double dblDen)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dblDen_local;
  double dbl_local;
  
  if (dblDen <= 0.0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/DateUtilities.cpp"
                                ,0xa7,"(dblDen > 0)","value not positive");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  dblDen_local = fmod(dbl,dblDen);
  if (dblDen_local < 0.0) {
    dblDen_local = dblDen + dblDen_local;
  }
  if ((dblDen_local < 0.0) || (dblDen <= dblDen_local)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/DateUtilities.cpp"
                                ,0xad,"(dbl >= 0 && dbl < dblDen)","");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return dblDen_local;
}

Assistant:

double
    DateUtilities::DblModPos(double dbl, double dblDen)
    {
        AssertMsg(dblDen > 0, "value not positive");
        dbl = fmod(dbl, dblDen);
        if (dbl < 0)
        {
            dbl += dblDen;
        }
        AssertMsg(dbl >= 0 && dbl < dblDen, "");
        return dbl;
    }